

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

size_t Assimp::FBX::ParseTokenAsDim(Token *t)

{
  allocator<char> local_41;
  string local_40;
  size_t local_20;
  size_t i;
  char *err;
  Token *t_local;
  
  err = (char *)t;
  local_20 = ParseTokenAsDim(t,(char **)&i);
  if (i != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)i,&local_41);
    anon_unknown.dwarf_d3af7e::ParseError(&local_40,(Token *)err);
  }
  return local_20;
}

Assistant:

size_t ParseTokenAsDim(const Token& t)
{
    const char* err;
    const size_t i = ParseTokenAsDim(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}